

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void set_node_pos(c2m_ctx_t c2m_ctx,node_t_conflict n,pos_t pos)

{
  VARR_pos_t *pVVar1;
  ulong uVar2;
  pos_t *ppVar3;
  ulong uVar4;
  size_t sVar5;
  char *op;
  
  do {
    pVVar1 = c2m_ctx->node_positions;
    if (pVVar1 == (VARR_pos_t *)0x0) {
      op = "length";
LAB_0014e4c7:
      mir_varr_assert_fail(op,"pos_t");
    }
    uVar2 = (ulong)n->uid;
    uVar4 = pVVar1->els_num;
    if (uVar2 < uVar4) {
      ppVar3 = pVVar1->varr;
      if (ppVar3 != (pos_t *)0x0) {
        ppVar3[uVar2].fname = pos.fname;
        ppVar3[uVar2].lno = (int)pos._8_8_;
        ppVar3[uVar2].ln_pos = (int)((ulong)pos._8_8_ >> 0x20);
        return;
      }
      op = "set";
      goto LAB_0014e4c7;
    }
    ppVar3 = pVVar1->varr;
    if (ppVar3 == (pos_t *)0x0) {
      op = "expand";
      goto LAB_0014e4c7;
    }
    uVar2 = uVar4 + 1;
    if (pVVar1->size <= uVar4) {
      sVar5 = (uVar2 >> 1) + uVar2;
      ppVar3 = (pos_t *)realloc(ppVar3,sVar5 * 0x10);
      pVVar1->varr = ppVar3;
      pVVar1->size = sVar5;
      uVar4 = pVVar1->els_num;
      uVar2 = uVar4 + 1;
    }
    pVVar1->els_num = uVar2;
    ppVar3[uVar4].fname = (char *)0x0;
    ppVar3[uVar4].lno = -1;
    ppVar3[uVar4].ln_pos = -1;
  } while( true );
}

Assistant:

static void set_node_pos (c2m_ctx_t c2m_ctx, node_t n, pos_t pos) {
  while (n->uid >= VARR_LENGTH (pos_t, node_positions)) VARR_PUSH (pos_t, node_positions, no_pos);
  VARR_SET (pos_t, node_positions, n->uid, pos);
}